

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  socket_t sVar4;
  Error EVar5;
  const_iterator cVar6;
  long lVar7;
  string **ppsVar8;
  undefined8 *puVar9;
  byte bVar10;
  string ip;
  anon_class_72_9_423fa509 in_stack_fffffffffffffe80;
  int local_12c;
  _Any_data local_128;
  code *local_118;
  undefined8 local_110;
  time_t local_108;
  time_t local_100;
  time_t local_f8;
  time_t local_f0;
  time_t local_e8;
  time_t local_e0;
  string local_d8;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  string *local_78;
  int *local_70;
  Error *local_68;
  time_t *local_60;
  time_t *local_58;
  time_t *local_50;
  time_t *local_48;
  time_t *local_40;
  time_t *local_38;
  
  bVar10 = 0;
  if (((this->proxy_host_)._M_string_length == 0) || (iVar2 = this->proxy_port_, iVar2 == -1)) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->addr_map_)._M_t,&this->host_);
    if ((_Rb_tree_header *)cVar6._M_node != &(this->addr_map_)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (cVar6._M_node + 2));
    }
    iVar2 = this->port_;
    iVar3 = this->address_family_;
    bVar1 = this->tcp_nodelay_;
    std::function<void_(int)>::function((function<void_(int)> *)&local_b8,&this->socket_options_);
    local_e0 = this->connection_timeout_sec_;
    local_e8 = this->connection_timeout_usec_;
    local_f0 = this->read_timeout_sec_;
    local_f8 = this->read_timeout_usec_;
    local_100 = this->write_timeout_sec_;
    local_108 = this->write_timeout_usec_;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    local_118 = (code *)0x0;
    local_110 = uStack_a0;
    if (local_a8 != (code *)0x0) {
      local_128._M_unused._M_object = local_b8._M_unused._M_object;
      local_128._8_8_ = local_b8._8_8_;
      local_118 = local_a8;
      local_a8 = (code *)0x0;
      uStack_a0 = 0;
    }
    local_78 = &this->interface_;
    local_70 = &local_12c;
    local_68 = error;
    local_60 = &local_e0;
    local_58 = &local_e8;
    local_50 = &local_f0;
    local_48 = &local_f8;
    local_40 = &local_100;
    local_38 = &local_108;
    ppsVar8 = &local_78;
    puVar9 = (undefined8 *)&stack0xfffffffffffffe80;
    local_12c = iVar3;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar9 = *ppsVar8;
      ppsVar8 = ppsVar8 + (ulong)bVar10 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
    }
    sVar4 = detail::
            create_socket<httplib::detail::create_client_socket(std::__cxx11::string_const&,std::__cxx11::string_const&,int,int,bool,std::function<void(int)>,long,long,long,long,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                      (&this->host_,&local_d8,iVar2,iVar3,0,bVar1,(SocketOptions *)&local_128,
                       in_stack_fffffffffffffe80);
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,__destroy_functor);
    }
    EVar5 = Success;
    if (sVar4 == -1) {
      if (*error == Success) {
        EVar5 = Connection;
        goto LAB_001669bc;
      }
    }
    else {
LAB_001669bc:
      *error = EVar5;
    }
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return sVar4;
    }
    goto LAB_001669fd;
  }
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  iVar3 = this->address_family_;
  bVar1 = this->tcp_nodelay_;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::function<void_(int)>::function((function<void_(int)> *)&local_98,&this->socket_options_);
  local_e0 = this->connection_timeout_sec_;
  local_e8 = this->connection_timeout_usec_;
  local_f0 = this->read_timeout_sec_;
  local_f8 = this->read_timeout_usec_;
  local_100 = this->write_timeout_sec_;
  local_108 = this->write_timeout_usec_;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_118 = (code *)0x0;
  local_110 = uStack_80;
  if (local_88 != (code *)0x0) {
    local_128._M_unused._M_object = local_98._M_unused._M_object;
    local_128._8_8_ = local_98._8_8_;
    local_118 = local_88;
    local_88 = (code *)0x0;
    uStack_80 = 0;
  }
  local_78 = &this->interface_;
  local_70 = &local_12c;
  local_68 = error;
  local_60 = &local_e0;
  local_58 = &local_e8;
  local_50 = &local_f0;
  local_48 = &local_f8;
  local_40 = &local_100;
  local_38 = &local_108;
  ppsVar8 = &local_78;
  puVar9 = (undefined8 *)&stack0xfffffffffffffe80;
  local_12c = iVar3;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar10 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
  }
  sVar4 = detail::
          create_socket<httplib::detail::create_client_socket(std::__cxx11::string_const&,std::__cxx11::string_const&,int,int,bool,std::function<void(int)>,long,long,long,long,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                    (&this->proxy_host_,&local_d8,iVar2,iVar3,0,bVar1,(SocketOptions *)&local_128,
                     in_stack_fffffffffffffe80);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  EVar5 = Success;
  if (sVar4 == -1) {
    if (*error == Success) {
      EVar5 = Connection;
      goto LAB_001667e7;
    }
  }
  else {
LAB_001667e7:
    *error = EVar5;
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return sVar4;
  }
LAB_001669fd:
  operator_delete(local_d8._M_dataplus._M_p,
                  CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                           local_d8.field_2._M_local_buf[0]) + 1);
  return sVar4;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
  if (!proxy_host_.empty() && proxy_port_ != -1) {
    return detail::create_client_socket(
        proxy_host_, std::string(), proxy_port_, address_family_, tcp_nodelay_,
        socket_options_, connection_timeout_sec_, connection_timeout_usec_,
        read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
        write_timeout_usec_, interface_, error);
  }

  // Check is custom IP specified for host_
  std::string ip;
  auto it = addr_map_.find(host_);
  if (it != addr_map_.end()) ip = it->second;

  return detail::create_client_socket(
      host_, ip, port_, address_family_, tcp_nodelay_, socket_options_,
      connection_timeout_sec_, connection_timeout_usec_, read_timeout_sec_,
      read_timeout_usec_, write_timeout_sec_, write_timeout_usec_, interface_,
      error);
}